

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

void __thiscall QStyleSheetStyle::setPalette(QStyleSheetStyle *this,QWidget *w)

{
  ColorGroup CVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  ulong uVar4;
  char cVar5;
  QPalette *pQVar6;
  QWidget *w_00;
  quint64 qVar7;
  int i;
  long lVar8;
  anon_union_24_3_e3d07ef4_for_data *this_00;
  QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_> *this_01;
  long in_FS_OFFSET;
  QWidget *copy;
  QRenderRule rule;
  QWidget *local_118;
  QRenderRule local_110;
  undefined1 local_88 [16];
  anon_union_24_3_e3d07ef4_for_data local_78;
  ulong local_60;
  ColorGroup local_58 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58[0] = 0x80000001;
  local_58[1] = Active;
  local_58[2] = Inactive;
  local_58[3] = Disabled;
  local_58[4] = Disabled;
  local_58[5] = Inactive;
  cVar5 = QCoreApplication::testAttribute(AA_UseStyleSheetPropagationInWidgetStyles);
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPalette::QPalette((QPalette *)local_88);
  if (cVar5 == '\0') {
    pQVar6 = QWidget::palette(w);
    QPalette::operator=((QPalette *)local_88,pQVar6);
  }
  w_00 = embeddedWidget(w);
  lVar8 = 0;
  do {
    memset(&local_110,0xaa,0x88);
    CVar1 = local_58[lVar8 * 2];
    qVar7 = extendedPseudoClass(w);
    renderRule(&local_110,this,&w->super_QObject,0,(long)(int)CVar1 | qVar7);
    if (lVar8 == 0) {
      QObject::property((char *)local_78.data);
      uVar4 = local_60;
      ::QVariant::~QVariant((QVariant *)&local_78);
      if (uVar4 < 4) {
        this_00 = &local_78;
        QWidgetPrivate::localFont((QWidgetPrivate *)&local_78);
        saveWidgetFont((QStyleSheetStyle *)this_00->data,w,(QFont *)local_78.data);
        QFont::~QFont((QFont *)local_78.data);
      }
      updateStyleSheetFont(this,w);
      if (w_00 != w) {
        updateStyleSheetFont(this,w_00);
      }
    }
    QRenderRule::configurePalette
              (&local_110,(QPalette *)local_88,local_58[lVar8 * 2 + 1],w_00,w_00 != w);
    QPainterPath::~QPainterPath(&local_110.clipPath);
    QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_110.iconPtr);
    QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_110.img);
    if (local_110.p.d.ptr != (QStyleSheetPositionData *)0x0) {
      LOCK();
      *(int *)local_110.p.d.ptr = *(int *)local_110.p.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_110.p.d.ptr == 0) && (local_110.p.d.ptr != (QStyleSheetPositionData *)0x0))
      {
        operator_delete((void *)local_110.p.d.ptr,0x24);
      }
    }
    if (local_110.geo.d.ptr != (QStyleSheetGeometryData *)0x0) {
      LOCK();
      *(int *)local_110.geo.d.ptr = *(int *)local_110.geo.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_110.geo.d.ptr == 0) &&
         (local_110.geo.d.ptr != (QStyleSheetGeometryData *)0x0)) {
        operator_delete((void *)local_110.geo.d.ptr,0x1c);
      }
    }
    QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&local_110.ou);
    QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_110.bd);
    QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_110.bg);
    if (local_110.b.d.ptr != (QStyleSheetBoxData *)0x0) {
      LOCK();
      *(int *)local_110.b.d.ptr = *(int *)local_110.b.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_110.b.d.ptr == 0) && (local_110.b.d.ptr != (QStyleSheetBoxData *)0x0)) {
        operator_delete((void *)local_110.b.d.ptr,0x28);
      }
    }
    QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_110.pal);
    QHash<QString,_QVariant>::~QHash(&local_110.styleHints);
    QFont::~QFont(&local_110.font);
    QBrush::~QBrush((QBrush *)((long)&local_110 + 8));
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  if (cVar5 != '\0') {
    lVar8 = QPalette::resolveMask();
    if (lVar8 == 0) goto LAB_0035bf97;
  }
  local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar6 = QWidget::palette(w);
  QPalette::QPalette((QPalette *)&local_78,pQVar6);
  this_01 = &styleSheetCaches->customPaletteWidgets;
  QPalette::QPalette((QPalette *)&local_110,(QPalette *)&local_78);
  local_110._16_8_ = QPalette::resolveMask();
  local_118 = w;
  QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>>::
  emplace<QStyleSheetStyleCaches::Tampered<QPalette>const&>
            ((QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>> *)this_01,&local_118,
             (Tampered<QPalette> *)&local_110);
  QPalette::~QPalette((QPalette *)&local_110);
  if (cVar5 != '\0') {
    QPalette::resolve((QPalette *)&local_110);
    uVar2 = local_88._0_8_;
    uVar3 = local_88._8_4_;
    local_88[8] = local_110.defaultBackground;
    local_88._9_3_ = local_110._9_3_;
    local_110._8_4_ = uVar3;
    local_88._0_8_ = local_110._0_8_;
    local_110._0_8_ = uVar2;
    QPalette::~QPalette((QPalette *)&local_110);
    QPalette::resolveMask();
    QPalette::resolveMask();
    QPalette::setResolveMask((ulonglong)local_88);
  }
  QWidget::setPalette(w,(QPalette *)local_88);
  if (w_00 != w) {
    QWidget::setPalette(w_00,(QPalette *)local_88);
  }
  QPalette::~QPalette((QPalette *)&local_78);
LAB_0035bf97:
  QPalette::~QPalette((QPalette *)local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyle::setPalette(QWidget *w)
{
    struct RuleRoleMap {
        int state;
        QPalette::ColorGroup group;
    } map[3] = {
        { int(PseudoClass_Active | PseudoClass_Enabled), QPalette::Active },
        { PseudoClass_Disabled, QPalette::Disabled },
        { PseudoClass_Enabled, QPalette::Inactive }
    };

    const bool useStyleSheetPropagationInWidgetStyles =
        QCoreApplication::testAttribute(Qt::AA_UseStyleSheetPropagationInWidgetStyles);

    QPalette p;
    if (!useStyleSheetPropagationInWidgetStyles)
        p = w->palette();

    QWidget *ew = embeddedWidget(w);

    for (int i = 0; i < 3; i++) {
        QRenderRule rule = renderRule(w, PseudoElement_None, map[i].state | extendedPseudoClass(w));
        if (i == 0) {
            if (!w->property("_q_styleSheetWidgetFont").isValid()) {
                saveWidgetFont(w, w->d_func()->localFont());
            }
            updateStyleSheetFont(w);
            if (ew != w)
                updateStyleSheetFont(ew);
        }

        rule.configurePalette(&p, map[i].group, ew, ew != w);
    }

    if (!useStyleSheetPropagationInWidgetStyles || p.resolveMask() != 0) {
        QPalette wp = w->palette();
        styleSheetCaches->customPaletteWidgets.insert(w, {wp, p.resolveMask()});

        if (useStyleSheetPropagationInWidgetStyles) {
            p = p.resolve(wp);
            p.setResolveMask(p.resolveMask() | wp.resolveMask());
        }

        w->setPalette(p);
        if (ew != w)
            ew->setPalette(p);
    }
}